

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

string_feeder_t * string_feeder_create(char *str)

{
  string_feeder_t *psVar1;
  char *__s;
  size_t sVar2;
  
  if (str != (char *)0x0) {
    psVar1 = (string_feeder_t *)calloc(1,0x20);
    __s = strdup(str);
    psVar1->s = __s;
    sVar2 = strlen(__s);
    psVar1->len = sVar2;
    psVar1->line = 1;
    psVar1->col = 0;
    psVar1->pos = 0;
    return psVar1;
  }
  __assert_fail("str != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x1bc,"string_feeder_t *string_feeder_create(const char *)");
}

Assistant:

string_feeder_t *string_feeder_create(const char *str)
{
    assert(str != NULL);

    string_feeder_t *sf = (string_feeder_t*) calloc(1, sizeof(string_feeder_t));
    sf->s = strdup(str);
    sf->len = strlen(sf->s);
    sf->line = 1;
    sf->col = 0;
    sf->pos = 0;
    return sf;
}